

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_text
          (Image *this,ssize_t x,ssize_t y,ssize_t *width,ssize_t *height,uint32_t color,
          uint32_t background,char *fmt,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [48];
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined1 local_78 [8];
  va_list va;
  uint32_t color_local;
  ssize_t *height_local;
  ssize_t *width_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *this_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_138;
  va[0]._0_8_ = &stack0x00000018;
  local_78._4_4_ = 0x30;
  local_78._0_4_ = 0x30;
  va[0].reg_save_area._4_4_ = color;
  draw_text_v(this,x,y,width,height,(ulong)(color >> 0x18),(ulong)(color >> 0x10 & 0xff),
              (ulong)(byte)(color >> 8),(ulong)(color & 0xff),(ulong)(background >> 0x18),
              (ulong)(background >> 0x10 & 0xff),(ulong)(byte)(background >> 8),
              (ulong)(background & 0xff),fmt,(__va_list_tag *)local_78);
  return;
}

Assistant:

void Image::draw_text(ssize_t x, ssize_t y, ssize_t* width, ssize_t* height,
    uint32_t color, uint32_t background, const char* fmt, ...) {
  va_list va;
  va_start(va, fmt);
  try {
    this->draw_text_v(x, y, width, height,
        (color >> 24) & 0xFF, (color >> 16) & 0xFF, (color >> 8) & 0xFF, color & 0xFF,
        (background >> 24) & 0xFF, (background >> 16) & 0xFF, (background >> 8) & 0xFF, background & 0xFF,
        fmt, va);
  } catch (...) {
    va_end(va);
    throw;
  }
  va_end(va);
}